

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

QRect __thiscall QWidget::childrenRect(QWidget *this)

{
  long lVar1;
  long lVar2;
  QRect QVar3;
  int i;
  ulong uVar4;
  long in_FS_OFFSET;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  local_38.x1.m_i = 0;
  local_38.y1.m_i = 0;
  local_38.x2.m_i = -1;
  local_38.y2.m_i = -1;
  for (uVar4 = 0; uVar4 < *(ulong *)(lVar1 + 0x28); uVar4 = uVar4 + 1) {
    lVar2 = *(long *)(*(long *)(lVar1 + 0x20) + uVar4 * 8);
    if ((((lVar2 != 0) && ((*(byte *)(*(long *)(lVar2 + 8) + 0x30) & 1) != 0)) &&
        (lVar2 = *(long *)(lVar2 + 0x20), (*(byte *)(lVar2 + 0xc) & 1) == 0)) &&
       ((*(byte *)(lVar2 + 10) & 1) == 0)) {
      QRect::operator|=(&local_38,(QRect *)(lVar2 + 0x14));
    }
  }
  QVar3.y1.m_i = local_38.y1.m_i;
  QVar3.x1.m_i = local_38.x1.m_i;
  QVar3.x2.m_i = local_38.x2.m_i;
  QVar3.y2.m_i = local_38.y2.m_i;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QWidget::childrenRect() const
{
    Q_D(const QWidget);
    QRect r(0, 0, 0, 0);
    for (int i = 0; i < d->children.size(); ++i) {
        QWidget *w = qobject_cast<QWidget *>(d->children.at(i));
        if (w && !w->isWindow() && !w->isHidden())
            r |= w->geometry();
    }
    return r;
}